

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void spitParseErrors(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *errors)

{
  pointer pbVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error;
  pointer pbVar3;
  
  std::operator<<((ostream *)&std::cout,"syntax errors:\n");
  pbVar1 = (errors->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (errors->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)pbVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void spitParseErrors(std::vector<string> errors){
    cout << "syntax errors:\n";
    for(auto& error : errors){
        cout << error << endl;
    }
}